

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

size_t __thiscall
ddd::DaTrie<true,_true,_true>::edge_size_
          (DaTrie<true,_true,_true> *this,uint32_t node_pos,size_t upper)

{
  pointer pNVar1;
  Bc BVar2;
  pointer pNVar3;
  size_t sVar4;
  ulong uVar5;
  pointer pNVar6;
  
  BVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
          super__Vector_impl_data._M_start[node_pos];
  uVar5 = (ulong)BVar2 & 0x7fffffff;
  if (uVar5 == 0x7fffffff || BVar2._0_4_ < 0) {
    return 0;
  }
  pNVar3 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar1 = pNVar3 + node_pos;
  sVar4 = 0;
  pNVar6 = pNVar1;
  do {
    sVar4 = sVar4 + 1;
    if (upper <= sVar4) {
      return upper + (upper == 0);
    }
    pNVar6 = (pointer)&pNVar3[(uint)pNVar6->child ^ (uint)uVar5].sib;
  } while (*(uint8_t *)pNVar6 != pNVar1->child);
  return sVar4;
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }